

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_noise_estimate.c
# Opt level: O2

void av1_noise_estimate_init(NOISE_ESTIMATE *ne,int width,int height)

{
  uint uVar1;
  long lVar2;
  
  ne->enabled = 0;
  lVar2 = (long)height * (long)width;
  ne->count = 0;
  ne->last_w = 0;
  ne->last_h = 0;
  uVar1 = 0x8c;
  if (0x1fa3ff < lVar2) {
    uVar1 = 200;
  }
  ne->level = (uint)(0xe0fff < lVar2);
  ne->value = 0;
  ne->thresh = 0x5a;
  if (lVar2 < 0xe1000) {
    if (lVar2 < 0x38400) {
      uVar1 = 0x5a;
      goto LAB_00225b68;
    }
    uVar1 = 0x73;
  }
  ne->thresh = uVar1;
LAB_00225b68:
  ne->num_frames_estimate = 0xf;
  ne->adapt_thresh = (uVar1 >> 1) + uVar1;
  return;
}

Assistant:

void av1_noise_estimate_init(NOISE_ESTIMATE *const ne, int width, int height) {
  const int64_t area = (int64_t)width * height;
  ne->enabled = 0;
  ne->level = (area < 1280 * 720) ? kLowLow : kLow;
  ne->value = 0;
  ne->count = 0;
  ne->thresh = 90;
  ne->last_w = 0;
  ne->last_h = 0;
  if (area >= 1920 * 1080) {
    ne->thresh = 200;
  } else if (area >= 1280 * 720) {
    ne->thresh = 140;
  } else if (area >= 640 * 360) {
    ne->thresh = 115;
  }
  ne->num_frames_estimate = 15;
  ne->adapt_thresh = (3 * ne->thresh) >> 1;
}